

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<double>::QControlledGate2
          (QControlledGate2<double> *this,int control,int controlState)

{
  uint __line;
  char *__assertion;
  
  (this->super_QGate2<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001223f8;
  this->control_ = control;
  this->controlState_ = controlState;
  if (control < 0) {
    __assertion = "control >= 0";
    __line = 0x22;
  }
  else {
    if ((uint)controlState < 2) {
      return;
    }
    __assertion = "( controlState == 0 ) || ( controlState == 1 )";
    __line = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                ,__line,
                "qclab::qgates::QControlledGate2<double>::QControlledGate2(const int, const int) [T = double]"
               );
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }